

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

GraphCycles * __thiscall
xla::GraphCycles::Path_abi_cxx11_(GraphCycles *this,int x,int y,int max_path_len)

{
  int iVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  int32_t in_R8D;
  char local_a8 [8];
  char buf [20];
  int local_84;
  int i;
  uint local_78;
  int np;
  int32_t path [20];
  int max_path_len_local;
  int y_local;
  int x_local;
  GraphCycles *this_local;
  string *result;
  
  if ((Path[abi:cxx11](int,int,int)::kPathSize == '\0') &&
     (path[0x13] = in_R8D, iVar1 = __cxa_guard_acquire(&Path[abi:cxx11](int,int,int)::kPathSize),
     iVar1 != 0)) {
    Path::kPathSize = path[0x13];
    __cxa_guard_release(&Path[abi:cxx11](int,int,int)::kPathSize);
  }
  iVar1 = FindPath((GraphCycles *)CONCAT44(in_register_00000034,x),y,max_path_len,Path::kPathSize,
                   (int32_t *)&local_78);
  std::__cxx11::string::string((string *)this);
  local_84 = 0;
  while( true ) {
    if (iVar1 <= local_84) {
      return this;
    }
    if (Path::kPathSize <= local_84) break;
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::push_back((char)this);
    }
    snprintf(local_a8,0x14,"%d",(ulong)(&local_78)[local_84]);
    std::__cxx11::string::operator+=((string *)this,local_a8);
    local_84 = local_84 + 1;
  }
  std::__cxx11::string::operator+=((string *)this," ...");
  return this;
}

Assistant:

std::string GraphCycles::Path(int x, int y, const int max_path_len) {
  static const int kPathSize = max_path_len;
  int32_t path[max_path_len_20];
  int np = FindPath(x, y, kPathSize, path);
  std::string result;
  for (int i = 0; i < np; i++) {
      if (i >= kPathSize) {
          result += " ...";
          break;
      }
      if (!result.empty())
          result.push_back(' ');
      char buf[20];
      snprintf(buf, sizeof(buf), "%d", path[i]);
      result += buf;
  }
  return result;
}